

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void httplib::detail::get_remote_ip_and_port(socket_t sock,string *ip,int *port)

{
  int iVar1;
  socklen_t local_b4;
  int local_b0;
  socklen_t len;
  ucred ucred;
  socklen_t addr_len;
  sockaddr_storage addr;
  int *port_local;
  string *ip_local;
  socket_t sock_local;
  
  ucred.uid = 0x80;
  iVar1 = getpeername(sock,(sockaddr *)&ucred.gid,&ucred.uid);
  if (iVar1 == 0) {
    if ((short)ucred.gid == 1) {
      local_b4 = 0xc;
      iVar1 = getsockopt(sock,1,0x11,&local_b0,&local_b4);
      if (iVar1 == 0) {
        *port = local_b0;
      }
    }
    else {
      get_ip_and_port((sockaddr_storage *)&ucred.gid,ucred.uid,ip,port);
    }
  }
  return;
}

Assistant:

inline void get_remote_ip_and_port(socket_t sock, std::string &ip, int &port) {
  struct sockaddr_storage addr;
  socklen_t addr_len = sizeof(addr);

  if (!getpeername(sock, reinterpret_cast<struct sockaddr *>(&addr),
                   &addr_len)) {
#ifndef _WIN32
    if (addr.ss_family == AF_UNIX) {
#if defined(__linux__)
      struct ucred ucred;
      socklen_t len = sizeof(ucred);
      if (getsockopt(sock, SOL_SOCKET, SO_PEERCRED, &ucred, &len) == 0) {
        port = ucred.pid;
      }
#elif defined(SOL_LOCAL) && defined(SO_PEERPID) // __APPLE__
      pid_t pid;
      socklen_t len = sizeof(pid);
      if (getsockopt(sock, SOL_LOCAL, SO_PEERPID, &pid, &len) == 0) {
        port = pid;
      }
#endif
      return;
    }
#endif
    get_ip_and_port(addr, addr_len, ip, port);
  }
}